

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeKernelSetGroupSize
          (ze_kernel_handle_t hKernel,uint32_t groupSizeX,uint32_t groupSizeY,uint32_t groupSizeZ)

{
  ze_pfnKernelSetGroupSize_t pfnSetGroupSize;
  ze_result_t result;
  uint32_t groupSizeZ_local;
  uint32_t groupSizeY_local;
  uint32_t groupSizeX_local;
  ze_kernel_handle_t hKernel_local;
  
  pfnSetGroupSize._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c6a0 != (code *)0x0) {
    pfnSetGroupSize._0_4_ = (*DAT_0011c6a0)(hKernel,groupSizeX,groupSizeY,groupSizeZ);
  }
  return (ze_result_t)pfnSetGroupSize;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetGroupSize(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t groupSizeX,                            ///< [in] group size for X dimension to use for this kernel
        uint32_t groupSizeY,                            ///< [in] group size for Y dimension to use for this kernel
        uint32_t groupSizeZ                             ///< [in] group size for Z dimension to use for this kernel
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetGroupSize = context.zeDdiTable.Kernel.pfnSetGroupSize;
        if( nullptr != pfnSetGroupSize )
        {
            result = pfnSetGroupSize( hKernel, groupSizeX, groupSizeY, groupSizeZ );
        }
        else
        {
            // generic implementation
        }

        return result;
    }